

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool __thiscall ON_NurbsCurve::RemoveSpan(ON_NurbsCurve *this,int span_index)

{
  double dVar1;
  double dVar2;
  int cv_dim;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  size_t __n;
  double *pdVar8;
  double *pdVar9;
  double local_c0;
  double local_b8;
  double local_98;
  double local_88;
  double *knot0_local;
  double *cv0;
  int span_index0;
  int m;
  int i1;
  int i0;
  int k1;
  int k0;
  bool bIsPeriodic0;
  double knot_delta;
  double knot1;
  double knot0;
  int j;
  int i;
  size_t sizeof_cv;
  int cv_size;
  int span_index_local;
  ON_NurbsCurve *this_local;
  
  cv_dim = CVSize(this);
  if (((((this->m_order < 2) || (this->m_cv_count < this->m_order)) || (this->m_dim < 1)) ||
      ((this->m_cv_stride < cv_dim || (this->m_knot == (double *)0x0)))) ||
     (this->m_cv == (double *)0x0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbscurve.cpp"
               ,0x105d,"","Invalid NURBS curve.");
    this_local._7_1_ = false;
  }
  else if ((span_index < 0) || (this->m_cv_count - this->m_order < span_index)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbscurve.cpp"
               ,0x1063,"","span_index parameter is out of range.");
    this_local._7_1_ = false;
  }
  else if (this->m_cv_count == this->m_order) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbscurve.cpp"
               ,0x1069,"","Cannot remove the only span from a Bezier NURBS curve.");
    this_local._7_1_ = false;
  }
  else {
    __n = (long)cv_dim << 3;
    dVar1 = this->m_knot[span_index + this->m_order + -2];
    dVar2 = this->m_knot[span_index + this->m_order + -1];
    if (dVar2 <= dVar1) {
      local_88 = 0.0;
    }
    else {
      local_88 = dVar2 - dVar1;
    }
    iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x35])();
    if (span_index < 1) {
      sizeof_cv._4_4_ = 1;
      while ((sizeof_cv._4_4_ < this->m_cv_count - this->m_order &&
             (this->m_knot[sizeof_cv._4_4_ + this->m_order + -1] <=
              this->m_knot[sizeof_cv._4_4_ + this->m_order + -2]))) {
        sizeof_cv._4_4_ = sizeof_cv._4_4_ + 1;
      }
      for (knot0._4_4_ = 0; knot0._4_4_ + sizeof_cv._4_4_ < this->m_cv_count;
          knot0._4_4_ = knot0._4_4_ + 1) {
        pdVar8 = CV(this,knot0._4_4_);
        pdVar9 = CV(this,knot0._4_4_ + sizeof_cv._4_4_);
        memcpy(pdVar8,pdVar9,__n);
      }
      for (knot0._4_4_ = 0; knot0._4_4_ + sizeof_cv._4_4_ < this->m_cv_count + this->m_order + -2;
          knot0._4_4_ = knot0._4_4_ + 1) {
        if ((dVar2 != this->m_knot[knot0._4_4_ + sizeof_cv._4_4_]) ||
           (local_98 = dVar1, NAN(dVar2) || NAN(this->m_knot[knot0._4_4_ + sizeof_cv._4_4_]))) {
          local_98 = this->m_knot[knot0._4_4_ + sizeof_cv._4_4_] - local_88;
        }
        this->m_knot[knot0._4_4_] = local_98;
      }
      this->m_cv_count = this->m_cv_count - sizeof_cv._4_4_;
    }
    else if (span_index < this->m_cv_count - this->m_order) {
      iVar4 = span_index + this->m_order + -2;
      i1 = span_index + this->m_order + -1;
      m = iVar4;
      while ((span_index0 = i1, 0 < m && (this->m_knot[iVar4] <= this->m_knot[m + -1]))) {
        m = m + -1;
      }
      while ((span_index0 < this->m_cv_count + this->m_order + -3 &&
             (this->m_knot[span_index0 + 1] < this->m_knot[i1] ||
              this->m_knot[span_index0 + 1] == this->m_knot[i1]))) {
        span_index0 = span_index0 + 1;
      }
      iVar5 = (span_index0 - m) + 1;
      if ((local_88 <= 0.0) &&
         (((this->m_knot[m] != this->m_knot[span_index0] ||
           (NAN(this->m_knot[m]) || NAN(this->m_knot[span_index0]))) || (iVar5 < this->m_order)))) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbscurve.cpp"
                   ,0x10aa,"","span_index parameter identifies an empty span.");
        return false;
      }
      iVar6 = m - (this->m_order + -1);
      knot0_local = (double *)0x0;
      if ((-1 < iVar6) && ((iVar4 - m) + 1 < this->m_order + -1)) {
        knot0_local = (double *)
                      onmalloc((long)(this->m_order * cv_dim + this->m_order * 2 + -2) << 3);
        iVar4 = this->m_order;
        memcpy(knot0_local + iVar4 * cv_dim,this->m_knot + iVar6,(long)(this->m_order * 2 + -2) << 3
              );
        for (knot0._4_4_ = 0; knot0._4_4_ < this->m_order; knot0._4_4_ = knot0._4_4_ + 1) {
          pdVar8 = CV(this,iVar6 + knot0._4_4_);
          memcpy(knot0_local + knot0._4_4_ * cv_dim,pdVar8,__n);
        }
        ON_ClampKnotVector(cv_dim,this->m_order,this->m_order,cv_dim,knot0_local,
                           knot0_local + iVar4 * cv_dim,1);
      }
      if (iVar5 < this->m_order + -1) {
        iVar5 = (this->m_order + -1) - iVar5;
        ReserveCVCapacity(this,this->m_cv_stride * (this->m_cv_count + iVar5));
        ReserveKnotCapacity(this,this->m_cv_count + this->m_order + -2 + iVar5);
        for (knot0._0_4_ = this->m_cv_count + this->m_order + -3;
            (span_index0 - this->m_order) + 2 <= knot0._0_4_; knot0._0_4_ = knot0._0_4_ + -1) {
          this->m_knot[knot0._0_4_ + iVar5] = this->m_knot[knot0._0_4_];
        }
        knot0._0_4_ = this->m_cv_count;
        while (knot0._0_4_ = knot0._0_4_ + -1, (span_index0 - this->m_order) + 2 <= knot0._0_4_) {
          pdVar8 = CV(this,knot0._0_4_ + iVar5);
          pdVar9 = CV(this,knot0._0_4_);
          memcpy(pdVar8,pdVar9,__n);
        }
        span_index0 = iVar5 + span_index0;
        i1 = iVar5 + i1;
        this->m_cv_count = iVar5 + this->m_cv_count;
      }
      if (span_index0 - i1 < this->m_order + -2) {
        ON_ClampKnotVector(cv_dim,this->m_order,this->m_order,this->m_cv_stride,
                           this->m_cv + ((span_index0 - this->m_order) + 2) * this->m_cv_stride,
                           this->m_knot + ((span_index0 - this->m_order) + 2),0);
      }
      iVar4 = (span_index0 - this->m_order) + 2;
      if (knot0_local != (double *)0x0) {
        for (knot0._4_4_ = 0; knot0._4_4_ < this->m_order + -1; knot0._4_4_ = knot0._4_4_ + 1) {
          pdVar8 = CV(this,knot0._4_4_ + iVar6);
          memcpy(pdVar8,knot0_local + knot0._4_4_ * cv_dim,__n);
        }
        onfree(knot0_local);
      }
      if (m < iVar4) {
        for (knot0._4_4_ = 0; knot0._4_4_ + iVar4 < this->m_cv_count; knot0._4_4_ = knot0._4_4_ + 1)
        {
          pdVar8 = CV(this,knot0._4_4_ + m);
          pdVar9 = CV(this,knot0._4_4_ + iVar4);
          memcpy(pdVar8,pdVar9,__n);
        }
        for (knot0._4_4_ = 0; knot0._4_4_ + iVar4 < this->m_cv_count + this->m_order + -2;
            knot0._4_4_ = knot0._4_4_ + 1) {
          if ((dVar2 != this->m_knot[knot0._4_4_ + iVar4]) ||
             (local_b8 = dVar1, NAN(dVar2) || NAN(this->m_knot[knot0._4_4_ + iVar4]))) {
            local_b8 = this->m_knot[knot0._4_4_ + iVar4] - local_88;
          }
          this->m_knot[knot0._4_4_ + m] = local_b8;
        }
        this->m_cv_count = this->m_cv_count - (iVar4 - m);
      }
      else if ((m == iVar4) && (0.0 < local_88)) {
        for (knot0._4_4_ = m; knot0._4_4_ < this->m_cv_count + this->m_order + -2;
            knot0._4_4_ = knot0._4_4_ + 1) {
          if ((dVar2 != this->m_knot[knot0._4_4_]) ||
             (local_c0 = dVar1, NAN(dVar2) || NAN(this->m_knot[knot0._4_4_]))) {
            local_c0 = this->m_knot[knot0._4_4_] - local_88;
          }
          this->m_knot[knot0._4_4_] = local_c0;
        }
      }
    }
    else {
      sizeof_cv._4_4_ = this->m_cv_count - this->m_order;
      do {
        sizeof_cv._4_4_ = sizeof_cv._4_4_ + -1;
        if (sizeof_cv._4_4_ < 1) break;
      } while (this->m_knot[sizeof_cv._4_4_ + this->m_order + -1] <=
               this->m_knot[sizeof_cv._4_4_ + this->m_order + -2]);
      this->m_cv_count = sizeof_cv._4_4_ + this->m_order;
    }
    if (((-(char)iVar3 & 1U) == 0) ||
       (uVar7 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x35])(),
       (uVar7 & 1) == 0)) {
      ClampEnd(this,2);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_NurbsCurve::RemoveSpan(
  int span_index 
  )
{
  const int cv_size = CVSize();
  if (    m_order < 2 
       || m_cv_count < m_order
       || m_dim <= 0
       || cv_size > m_cv_stride 
       || 0 == m_knot
       || 0 == m_cv
       )
  {
    ON_ERROR("Invalid NURBS curve.");
    return false;
  }

  if ( span_index < 0 || span_index > m_cv_count-m_order )
  {
    ON_ERROR("span_index parameter is out of range.");
    return false;
  }

  if ( m_cv_count == m_order )
  {
    ON_ERROR("Cannot remove the only span from a Bezier NURBS curve.");
    return false;
  }

  const size_t sizeof_cv = cv_size*sizeof(m_cv[0]);
  int i, j;

  const double knot0 = m_knot[span_index+m_order-2];
  const double knot1 = m_knot[span_index+m_order-1];
  const double knot_delta = (knot0 < knot1) ? (knot1 - knot0) : 0.0;

  const bool bIsPeriodic0 = IsPeriodic()?true:false;

  if ( span_index <= 0 )
  {
    // remove initial span
    // set span_index = index of the span to keep.
    for ( span_index = 1; span_index < m_cv_count-m_order; span_index++ )
    {
      if ( m_knot[span_index+m_order-2] < m_knot[span_index+m_order-1] )
        break;
    }
    for ( i = 0; i+span_index < m_cv_count; i++ )
      memcpy(CV(i),CV(i+span_index),sizeof_cv);
    for ( i = 0; i+span_index < m_cv_count+m_order-2; i++ )
    {
      m_knot[i] = (knot1 == m_knot[i+span_index])
                ? knot0
                : (m_knot[i+span_index] - knot_delta);
    }
    m_cv_count -= span_index;
  }
  else if ( span_index >= m_cv_count-m_order )
  {
    // remove final span
    // set span_index = index of the span to keep.
    for ( span_index = m_cv_count-m_order-1; span_index > 0; span_index-- )
    {
      if ( m_knot[span_index+m_order-2] < m_knot[span_index+m_order-1] )
        break;
    }
    m_cv_count = span_index+m_order;
  }
  else
  {
    // remove interior span
    int k0 = span_index+m_order-2;
    int k1 = span_index+m_order-1;
    int i0 = k0;
    int i1 = k1;
    for ( i0 = k0; i0 > 0; i0-- )
    {
      if ( m_knot[i0-1] < m_knot[k0] )
        break;
    }
    for ( i1 = k1; i1 < m_cv_count+m_order-3; i1++ )
    {
      if ( m_knot[i1+1] > m_knot[k1] )
        break;
    }
    int m = (i1-i0+1);
    if ( !(knot_delta > 0.0) )
    {
      if ( !(m_knot[i0] == m_knot[i1]) || m < m_order )
      {
        ON_ERROR("span_index parameter identifies an empty span.");
        return false;
      }
    }

    int span_index0 = i0 - (m_order-1);
    double* cv0 = 0;
    if ( span_index0 >= 0 && k0 - i0 + 1 < m_order-1 )
    {
      cv0 = (double*)onmalloc( (m_order*cv_size + 2*m_order-2)*sizeof(cv0[0]) );
      double* knot0_local = cv0 + (m_order*cv_size);
      memcpy( knot0_local, m_knot+span_index0, (2*m_order-2)*sizeof(knot0_local[0]) );
      for ( i = 0; i < m_order; i++ )
        memcpy( cv0 + (i*cv_size), CV(span_index0+i), sizeof_cv );
      ON_ClampKnotVector( cv_size, m_order, m_order, cv_size, cv0, knot0_local, 1 );
    }

    if ( m < m_order-1 )
    {
      i = m_order-1 - m;
      ReserveCVCapacity( m_cv_stride*(m_cv_count+i) );
      ReserveKnotCapacity( m_cv_count+m_order-2+i );
      for ( j = m_cv_count+m_order-3; j >= i1-m_order+2; j-- )
        m_knot[j+i] = m_knot[j];
      for ( j = m_cv_count-1; j >= i1-m_order+2; j-- )
        memcpy(CV(j+i),CV(j),sizeof_cv);
      i1 += i;
      k1 += i;
      m_cv_count += i;
    }

    if ( i1-k1 < m_order-2 )
      ON_ClampKnotVector( cv_size, m_order, m_order, m_cv_stride, 
                          m_cv + ((i1-m_order+2)*m_cv_stride), 
                          m_knot + (i1-m_order+2), 
                          0 );

    k0 = i0;
    k1 = i1-m_order+2;

    if ( 0 != cv0 )
    {
      for ( i = 0; i < m_order-1; i++ )
        memcpy(CV(i+span_index0),cv0 + (i*cv_size),sizeof_cv);
      onfree(cv0);
      cv0 = 0;
    }

    if ( k0 < k1 )
    {
      for ( i = 0; i + k1 < m_cv_count; i++ )
        memcpy(CV(i+k0),CV(i+k1),sizeof_cv);
      for ( i = 0; i + k1 < m_cv_count+m_order-2; i++ )
      {
        m_knot[i+k0] = (knot1 == m_knot[i+k1]) 
                     ? knot0
                     : (m_knot[i+k1] - knot_delta);
      }
      m_cv_count -= (k1-k0);
    }
    else if ( k0 == k1 && knot_delta > 0.0 )
    {
      for ( i = k0; i < m_cv_count+m_order-2; i++ )
      {
        m_knot[i] = (knot1 == m_knot[i])
                  ? knot0
                  : (m_knot[i] - knot_delta);
      }
    }
  }

  if ( false == bIsPeriodic0 || false == IsPeriodic() )
    ClampEnd(2);

  return true;
}